

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O2

void u_versionFromString_63(uint8_t *versionArray,char *versionString)

{
  char *in_RAX;
  ulong uVar1;
  ulong uVar2;
  char *end;
  
  if (versionArray != (uint8_t *)0x0) {
    if (versionString == (char *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar2 = 0;
      end = in_RAX;
      do {
        uVar1 = strtoul(versionString,&end,10);
        versionArray[uVar2] = (uint8_t)uVar1;
        uVar1 = uVar2;
        if ((end == versionString) || (uVar1 = 4, uVar2 == 3)) break;
        versionString = end + 1;
        uVar1 = uVar2 + 1;
        uVar2 = uVar1;
      } while (*end == '.');
      uVar1 = uVar1 & 0xffff;
    }
    for (; uVar1 != 4; uVar1 = uVar1 + 1) {
      versionArray[uVar1] = '\0';
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_versionFromString(UVersionInfo versionArray, const char *versionString) {
    char *end;
    uint16_t part=0;

    if(versionArray==NULL) {
        return;
    }

    if(versionString!=NULL) {
        for(;;) {
            versionArray[part]=(uint8_t)uprv_strtoul(versionString, &end, 10);
            if(end==versionString || ++part==U_MAX_VERSION_LENGTH || *end!=U_VERSION_DELIMITER) {
                break;
            }
            versionString=end+1;
        }
    }

    while(part<U_MAX_VERSION_LENGTH) {
        versionArray[part++]=0;
    }
}